

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall serialize_tests::varints::test_method(varints *this)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar4;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  int j;
  undefined4 uStack_18c;
  ulong local_188;
  char *local_180;
  char *local_178;
  undefined **local_170;
  undefined1 local_168;
  undefined1 *local_160;
  char *local_158;
  undefined1 local_150 [16];
  undefined ***local_140;
  int *local_138;
  assertion_result local_130;
  char *local_118;
  assertion_result local_110;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  lazy_ostream local_98;
  undefined ***local_88;
  ulong *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  DataStream local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_read_pos = 0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = 0;
  lVar3 = 0;
  while( true ) {
    local_170 = (undefined **)CONCAT44(local_170._4_4_,iVar1);
    if (99999 < iVar1) break;
    local_98._vptr_lazy_ostream = (_func_int **)&local_170;
    Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&>::Serialize<DataStream>
              ((Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)&local_98,&local_58);
    local_98._vptr_lazy_ostream = (_func_int **)&local_170;
    sVar2 = GetSerializeSize<Wrapper<VarIntFormatter<(VarIntMode)1>,int&>>
                      ((Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)&local_98);
    local_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_60 = "";
    local_78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x71;
    file.m_begin = (iterator)&local_68;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
    lVar3 = lVar3 + sVar2;
    local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (lVar3 == (long)local_58.vch.
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_58.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start + local_58.m_read_pos));
    local_130.m_message.px = (element_type *)0x0;
    local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_150._0_8_ = "size == ss.size()";
    local_150._8_8_ = "";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_88 = (undefined ***)boost::unit_test::lazy_ostream::inst;
    local_80 = (ulong *)local_150;
    local_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_a0 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_130,&local_98,1,0,WARN,_cVar4,(size_t)&local_a8,0x71);
    boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
    iVar1 = (int)local_170 + 1;
  }
  for (local_170 = (undefined **)0x0; local_170 < (undefined **)0x174876e800;
      local_170 = (undefined **)((long)local_170 + 0x3b9ac9c1)) {
    local_98._vptr_lazy_ostream = (_func_int **)&local_170;
    Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&>::Serialize<DataStream>
              ((Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)&local_98,&local_58);
    local_98._vptr_lazy_ostream = (_func_int **)&local_170;
    sVar2 = GetSerializeSize<Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_long&>>
                      ((Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)&local_98);
    local_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_b0 = "";
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x77;
    file_00.m_begin = (iterator)&local_b8;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,
               msg_00);
    lVar3 = lVar3 + sVar2;
    local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (lVar3 == (long)local_58.vch.
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_58.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start + local_58.m_read_pos));
    local_130.m_message.px = (element_type *)0x0;
    local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_150._0_8_ = "size == ss.size()";
    local_150._8_8_ = "";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_88 = (undefined ***)boost::unit_test::lazy_ostream::inst;
    local_80 = (ulong *)local_150;
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_d0 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_130,&local_98,1,0,WARN,_cVar4,(size_t)&local_d8,0x77);
    boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  }
  iVar1 = 0;
  while (local_188 = CONCAT44(local_188._4_4_,iVar1), iVar1 < 100000) {
    j = -1;
    iVar1 = ReadVarInt<DataStream,(VarIntMode)1,int>(&local_58);
    _j = CONCAT44(uStack_18c,iVar1);
    local_e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_e0 = "";
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x7e;
    file_01.m_begin = (iterator)&local_e8;
    msg_01.m_end = in_R9;
    msg_01.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_f8,
               msg_01);
    local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)((int)local_188 == j);
    local_110.m_message.px = (element_type *)0x0;
    local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_168 = 0;
    local_170 = &PTR__lazy_ostream_0114c730;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "decoded:";
    local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
    local_150._0_8_ = &PTR__lazy_ostream_0114c830;
    local_140 = &local_170;
    local_138 = &j;
    local_130.m_message.px = (element_type *)((ulong)local_130.m_message.px & 0xffffffffffffff00);
    local_130._0_8_ = &PTR__lazy_ostream_0114c870;
    local_130.m_message.pn.pi_ = (sp_counted_base *)local_150;
    local_118 = " expected:";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0114c8b0;
    local_88 = (undefined ***)&local_130;
    local_80 = &local_188;
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_178 = "";
    in_R8 = &DAT_00000001;
    in_R9 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              (&local_110,&local_98,1,1,WARN,_cVar4,(size_t)&local_180,0x7e);
    boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
    iVar1 = (int)local_188 + 1;
  }
  for (local_188 = 0; local_188 < 100000000000; local_188 = local_188 + 0x3b9ac9c1) {
    _j = 0xffffffffffffffff;
    _j = ReadVarInt<DataStream,(VarIntMode)0,unsigned_long>(&local_58);
    local_1a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_198 = "";
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x84;
    file_02.m_begin = (iterator)&local_1a0;
    msg_02.m_end = in_R9;
    msg_02.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
               msg_02);
    local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_188 == _j);
    local_110.m_message.px = (element_type *)0x0;
    local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_168 = 0;
    local_170 = &PTR__lazy_ostream_0114c730;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "decoded:";
    local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
    local_150._0_8_ = &PTR__lazy_ostream_0114c8f0;
    local_140 = &local_170;
    local_138 = &j;
    local_130.m_message.px = (element_type *)((ulong)local_130.m_message.px & 0xffffffffffffff00);
    local_130._0_8_ = &PTR__lazy_ostream_0114c930;
    local_130.m_message.pn.pi_ = (sp_counted_base *)local_150;
    local_118 = " expected:";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0114c970;
    local_88 = (undefined ***)&local_130;
    local_80 = &local_188;
    in_R8 = &DAT_00000001;
    in_R9 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              (&local_110,&local_98,1,1,WARN,0xc1b930,(size_t)&stack0xfffffffffffffe40,0x84);
    boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(varints)
{
    // encode

    DataStream ss{};
    DataStream::size_type size = 0;
    for (int i = 0; i < 100000; i++) {
        ss << VARINT_MODE(i, VarIntMode::NONNEGATIVE_SIGNED);
        size += ::GetSerializeSize(VARINT_MODE(i, VarIntMode::NONNEGATIVE_SIGNED));
        BOOST_CHECK(size == ss.size());
    }

    for (uint64_t i = 0;  i < 100000000000ULL; i += 999999937) {
        ss << VARINT(i);
        size += ::GetSerializeSize(VARINT(i));
        BOOST_CHECK(size == ss.size());
    }

    // decode
    for (int i = 0; i < 100000; i++) {
        int j = -1;
        ss >> VARINT_MODE(j, VarIntMode::NONNEGATIVE_SIGNED);
        BOOST_CHECK_MESSAGE(i == j, "decoded:" << j << " expected:" << i);
    }

    for (uint64_t i = 0;  i < 100000000000ULL; i += 999999937) {
        uint64_t j = std::numeric_limits<uint64_t>::max();
        ss >> VARINT(j);
        BOOST_CHECK_MESSAGE(i == j, "decoded:" << j << " expected:" << i);
    }
}